

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

unsigned_long
libssh2_channel_window_read_ex
          (LIBSSH2_CHANNEL *channel,unsigned_long *read_avail,unsigned_long *window_size_initial)

{
  uint uVar1;
  list_node *node;
  unsigned_long uVar2;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return 0;
  }
  if (window_size_initial != (unsigned_long *)0x0) {
    *window_size_initial = (ulong)(channel->remote).window_size_initial;
  }
  if (read_avail != (unsigned_long *)0x0) {
    node = (list_node *)_libssh2_list_first(&channel->session->packets);
    if (node == (list_node *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      do {
        if ((((ulong)(node[1].next)->next & 0xfe) == 0x5e) &&
           (uVar1 = _libssh2_ntohu32((uchar *)((long)&(node[1].next)->next + 1)),
           uVar1 == (channel->local).id)) {
          uVar2 = (long)node[1].prev + (uVar2 - (long)node[1].head);
        }
        node = (list_node *)_libssh2_list_next(node);
      } while (node != (list_node *)0x0);
    }
    *read_avail = uVar2;
  }
  return (ulong)(channel->remote).window_size;
}

Assistant:

LIBSSH2_API unsigned long
libssh2_channel_window_read_ex(LIBSSH2_CHANNEL *channel,
                               unsigned long *read_avail,
                               unsigned long *window_size_initial)
{
    if(!channel)
        return 0; /* no channel, no window! */

    if (window_size_initial) {
        *window_size_initial = channel->remote.window_size_initial;
    }

    if (read_avail) {
        size_t bytes_queued = 0;
        LIBSSH2_PACKET *packet =
            _libssh2_list_first(&channel->session->packets);

        while (packet) {
            unsigned char packet_type = packet->data[0];

            if (((packet_type == SSH_MSG_CHANNEL_DATA)
                 || (packet_type == SSH_MSG_CHANNEL_EXTENDED_DATA))
                && (_libssh2_ntohu32(packet->data + 1) == channel->local.id)) {
                bytes_queued += packet->data_len - packet->data_head;
            }

            packet = _libssh2_list_next(&packet->node);
        }

        *read_avail = bytes_queued;
    }

    return channel->remote.window_size;
}